

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.cpp
# Opt level: O3

void __thiscall chrono::fea::ChElementShellBST::~ChElementShellBST(ChElementShellBST *this)

{
  ~ChElementShellBST(this,&VTT);
  free(*(void **)&this[-1].field_0x298);
  return;
}

Assistant:

ChElementShellBST::~ChElementShellBST() {}